

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

char * CVodeGetLinReturnFlagName(long flag)

{
  char *__s;
  undefined8 in_RDI;
  char *name;
  
  __s = (char *)malloc(0x1e);
  switch(in_RDI) {
  case 0:
    sprintf(__s,"CVLS_SUCCESS");
    break;
  case 0xffffffffffffff9a:
    sprintf(__s,"CVLS_LMEMB_NULL");
    break;
  case 0xffffffffffffff9b:
    sprintf(__s,"CVLS_NO_ADJ");
    break;
  default:
    sprintf(__s,"NONE");
    break;
  case 0xfffffffffffffff7:
    sprintf(__s,"CVLS_SUNLS_FAIL");
    break;
  case 0xfffffffffffffff8:
    sprintf(__s,"CVLS_SUNMAT_FAIL");
    break;
  case 0xfffffffffffffff9:
    sprintf(__s,"CVLS_JACFUNC_RECVR");
    break;
  case 0xfffffffffffffffa:
    sprintf(__s,"CVLS_JACFUNC_UNRECVR");
    break;
  case 0xfffffffffffffffb:
    sprintf(__s,"CVLS_PMEM_NULL");
    break;
  case 0xfffffffffffffffc:
    sprintf(__s,"CVLS_MEM_FAIL");
    break;
  case 0xfffffffffffffffd:
    sprintf(__s,"CVLS_ILL_INPUT");
    break;
  case 0xfffffffffffffffe:
    sprintf(__s,"CVLS_LMEM_NULL");
    break;
  case 0xffffffffffffffff:
    sprintf(__s,"CVLS_MEM_NULL");
  }
  return __s;
}

Assistant:

char* CVodeGetLinReturnFlagName(long int flag)
{
  char* name = (char*)malloc(30 * sizeof(char));

  switch (flag)
  {
  case CVLS_SUCCESS: sprintf(name, "CVLS_SUCCESS"); break;
  case CVLS_MEM_NULL: sprintf(name, "CVLS_MEM_NULL"); break;
  case CVLS_LMEM_NULL: sprintf(name, "CVLS_LMEM_NULL"); break;
  case CVLS_ILL_INPUT: sprintf(name, "CVLS_ILL_INPUT"); break;
  case CVLS_MEM_FAIL: sprintf(name, "CVLS_MEM_FAIL"); break;
  case CVLS_PMEM_NULL: sprintf(name, "CVLS_PMEM_NULL"); break;
  case CVLS_JACFUNC_UNRECVR: sprintf(name, "CVLS_JACFUNC_UNRECVR"); break;
  case CVLS_JACFUNC_RECVR: sprintf(name, "CVLS_JACFUNC_RECVR"); break;
  case CVLS_SUNMAT_FAIL: sprintf(name, "CVLS_SUNMAT_FAIL"); break;
  case CVLS_SUNLS_FAIL: sprintf(name, "CVLS_SUNLS_FAIL"); break;
  case CVLS_NO_ADJ: sprintf(name, "CVLS_NO_ADJ"); break;
  case CVLS_LMEMB_NULL: sprintf(name, "CVLS_LMEMB_NULL"); break;
  default: sprintf(name, "NONE");
  }

  return (name);
}